

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

void * chck_pool_iter(chck_pool *pool,size_t *iter,_Bool reverse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  uint8_t *puVar4;
  void *pvVar5;
  uint8_t uVar6;
  
  if ((pool != (chck_pool *)0x0) && (iter != (size_t *)0x0)) {
    if ((pool->items).member == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *iter;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (pool->map).member;
        uVar3 = SUB168(auVar1 * auVar2,0);
        if ((SUB168(auVar1 * auVar2,8) == 0) && (uVar3 < (pool->map).used)) {
          puVar4 = (pool->map).buffer + uVar3;
        }
        else {
          puVar4 = (uint8_t *)0x0;
        }
        if (puVar4 == (uint8_t *)0x0) {
          uVar6 = '\0';
        }
        else {
          uVar6 = *puVar4;
        }
        pvVar5 = pool_buffer_iter(&pool->items,iter,reverse);
        if (uVar6 == '\0') {
          pvVar5 = (void *)0x0;
        }
      } while ((pvVar5 == (void *)0x0) && (*iter < (pool->map).used / (pool->map).member));
    }
    return pvVar5;
  }
  __assert_fail("pool && iter",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x19c,"void *chck_pool_iter(const struct chck_pool *, size_t *, _Bool)");
}

Assistant:

void*
chck_pool_iter(const struct chck_pool *pool, size_t *iter, bool reverse)
{
   assert(pool && iter);

   if (!pool->items.member)
      return NULL;

   void *current = NULL;
   do {
      const bool mapped = pool_is_mapped(pool, *iter);
      current = pool_buffer_iter(&pool->items, iter, reverse);
      current = (mapped ? current : NULL);
   } while (!current && *iter < pool->map.used / pool->map.member);

   return current;
}